

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::StringReplace
              (JavascriptString *match,JavascriptString *input,JavascriptString *replace)

{
  uint uVar1;
  char16 cVar2;
  code *pcVar3;
  bool bVar4;
  charcount_t cchPrefix;
  charcount_t cVar5;
  charcount_t cVar6;
  charcount_t cVar7;
  char *pcVar8;
  char16 *content;
  char16 *prefix;
  undefined4 *puVar9;
  JavascriptString *pJVar10;
  CharCount appendCharLength;
  CharCount i;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint startIndex;
  undefined1 local_278 [8];
  Builder<256U> concatenated;
  
  pcVar8 = JavascriptString::strstr((char *)input,(char *)match);
  cchPrefix = (charcount_t)pcVar8;
  if (cchPrefix == 0xffffffff) {
    return input;
  }
  content = JavascriptString::GetString(replace);
  cVar5 = JavascriptString::GetLength(replace);
  if (cVar5 == 0) {
LAB_00bdfb5b:
    prefix = JavascriptString::GetString(input);
    cVar5 = JavascriptString::GetLength(match);
    concatenated._544_8_ = prefix + ((ulong)pcVar8 & 0xffffffff) + (ulong)cVar5;
    cVar5 = JavascriptString::GetLength(input);
    cVar6 = JavascriptString::GetLength(match);
    cVar5 = cVar5 - (cVar6 + cchPrefix);
    cVar6 = JavascriptString::GetLength(replace);
    local_278 = (undefined1  [8])
                BufferStringBuilder::WritableString::New
                          (cchPrefix + cVar6 + cVar5,
                           (((((match->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr);
    cVar6 = JavascriptString::GetLength(replace);
    BufferStringBuilder::SetContent
              ((BufferStringBuilder *)local_278,prefix,cchPrefix,content,cVar6,
               (char16 *)concatenated._544_8_,cVar5);
    pJVar10 = BufferStringBuilder::ToString((BufferStringBuilder *)local_278);
  }
  else {
    cVar5 = JavascriptString::GetLength(replace);
    if (cVar5 < 9) {
      for (uVar12 = 0;
          (cVar5 = JavascriptString::GetLength(replace), uVar12 < cVar5 && (content[uVar12] != L'$')
          ); uVar12 = uVar12 + 1) {
      }
      cVar5 = JavascriptString::GetLength(replace);
      if (cVar5 <= (uint)uVar12) goto LAB_00bdfb5b;
    }
    CompoundString::Builder<256U>::Builder
              ((Builder<256U> *)local_278,
               (((((input->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
    startIndex = 0;
    CompoundString::Builder<256U>::Append((Builder<256U> *)local_278,input,0,cchPrefix);
    uVar13 = 0;
    while (cVar5 = JavascriptString::GetLength(replace), uVar13 < cVar5) {
      uVar11 = uVar13;
      if (content[uVar13] == L'$') {
        uVar1 = uVar13 + 1;
        cVar5 = JavascriptString::GetLength(replace);
        if (uVar1 < cVar5) {
          cVar2 = content[uVar1];
          pJVar10 = input;
          uVar11 = uVar1;
          if (cVar2 == L'`') {
            CompoundString::Builder<256U>::Append
                      ((Builder<256U> *)local_278,replace,startIndex,uVar13 - startIndex);
            startIndex = 0;
            appendCharLength = cchPrefix;
LAB_00bdfb45:
            CompoundString::Builder<256U>::Append
                      ((Builder<256U> *)local_278,pJVar10,startIndex,appendCharLength);
          }
          else {
            if (cVar2 != L'&') {
              if (cVar2 == L'\'') {
                CompoundString::Builder<256U>::Append
                          ((Builder<256U> *)local_278,replace,startIndex,uVar13 - startIndex);
                cVar5 = JavascriptString::GetLength(match);
                concatenated._544_4_ = cVar5 + cchPrefix;
                cVar5 = JavascriptString::GetLength(input);
                cVar6 = JavascriptString::GetLength(match);
                startIndex = concatenated._544_4_;
                appendCharLength = cVar5 - (cVar6 + cchPrefix);
              }
              else {
                if (cVar2 != L'$') goto LAB_00bdfb51;
                pJVar10 = replace;
                appendCharLength = uVar1 - startIndex;
              }
              goto LAB_00bdfb45;
            }
            CompoundString::Builder<256U>::Append
                      ((Builder<256U> *)local_278,replace,startIndex,uVar13 - startIndex);
            CompoundString::Builder<256U>::Append((Builder<256U> *)local_278,match);
          }
          startIndex = uVar13 + 2;
        }
      }
LAB_00bdfb51:
      uVar13 = uVar11 + 1;
    }
    if (uVar13 < startIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                  ,0x5c5,"(i <= j)","i <= j");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    CompoundString::Builder<256U>::Append
              ((Builder<256U> *)local_278,replace,startIndex,uVar13 - startIndex);
    cVar5 = JavascriptString::GetLength(match);
    cVar6 = JavascriptString::GetLength(input);
    cVar7 = JavascriptString::GetLength(match);
    CompoundString::Builder<256U>::Append
              ((Builder<256U> *)local_278,input,cVar5 + cchPrefix,cVar6 - (cVar7 + cchPrefix));
    pJVar10 = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_278);
  }
  return pJVar10;
}

Assistant:

Var RegexHelper::StringReplace(JavascriptString* match, JavascriptString* input, JavascriptString* replace)
    {
        CharCount matchedIndex = JavascriptString::strstr(input, match, true);
        if (matchedIndex == CharCountFlag)
        {
            return input;
        }

        const char16 *const replaceStr = replace->GetString();

        // Unfortunately, due to the possibility of there being $ escapes, we can't just wmemcpy the replace string. Check if we
        // have a small replace string that we can quickly scan for '$', to see if we can just wmemcpy.
        bool definitelyNoEscapes = replace->GetLength() == 0;
        if(!definitelyNoEscapes && replace->GetLength() <= 8)
        {
            CharCount i = 0;
            for(; i < replace->GetLength() && replaceStr[i] != _u('$'); ++i);
            definitelyNoEscapes = i >= replace->GetLength();
        }

        if(definitelyNoEscapes)
        {
            const char16* inputStr = input->GetString();
            const char16* prefixStr = inputStr;
            CharCount prefixLength = (CharCount)matchedIndex;
            const char16* postfixStr = inputStr + prefixLength + match->GetLength();
            CharCount postfixLength = input->GetLength() - prefixLength - match->GetLength();
            CharCount newLength = prefixLength + postfixLength + replace->GetLength();
            BufferStringBuilder bufferString(newLength, match->GetScriptContext());
            bufferString.SetContent(prefixStr, prefixLength,
                                    replaceStr, replace->GetLength(),
                                    postfixStr, postfixLength);
            return bufferString.ToString();
        }

        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(input->GetScriptContext());

        // Copy portion of input string that precedes the matched substring
        concatenated.Append(input, 0, matchedIndex);

        // Copy the replace string with substitutions
        CharCount i = 0, j = 0;
        for(; j < replace->GetLength(); ++j)
        {
            if(replaceStr[j] == _u('$') && j + 1 < replace->GetLength())
            {
                switch(replaceStr[j + 1])
                {
                    case _u('$'): // literal '$'
                        ++j;
                        concatenated.Append(replace, i, j - i);
                        i = j + 1;
                        break;

                    case _u('&'): // matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(match);
                        ++j;
                        i = j + 1;
                        break;

                    case _u('`'): // portion of input string that precedes the matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(input, 0, matchedIndex);
                        ++j;
                        i = j + 1;
                        break;

                    case _u('\''): // portion of input string that follows the matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(
                            input,
                            matchedIndex + match->GetLength(),
                            input->GetLength() - matchedIndex - match->GetLength());
                        ++j;
                        i = j + 1;
                        break;

                    default: // take both the initial '$' and the following character literally
                        ++j;
                }
            }
        }
        Assert(i <= j);
        concatenated.Append(replace, i, j - i);

        // Copy portion of input string that follows the matched substring
        concatenated.Append(input, matchedIndex + match->GetLength(), input->GetLength() - matchedIndex - match->GetLength());

        return concatenated.ToString();
    }